

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O3

int __thiscall CDataFileWriter::Finish(CDataFileWriter *this)

{
  int iVar1;
  CItemTypeInfo *pCVar2;
  CItemInfo *pCVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int i;
  long lVar7;
  long in_FS_OFFSET;
  CDatafileItemType Info;
  uint local_60;
  int local_5c;
  int local_58;
  undefined8 local_54;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_File == (IOHANDLE)0x0) {
    iVar5 = 0;
  }
  else {
    local_40 = this->m_NumItems;
    local_34 = 0;
    local_38 = 0;
    if (0 < (long)local_40) {
      lVar4 = 0;
      local_38 = 0;
      do {
        local_38 = local_38 + *(int *)((long)&this->m_pItems->m_Size + lVar4) + 8;
        lVar4 = lVar4 + 0x20;
      } while ((long)local_40 << 5 != lVar4);
    }
    local_3c = this->m_NumDatas;
    if (0 < (long)local_3c) {
      lVar4 = 0;
      local_34 = 0;
      do {
        local_34 = local_34 + *(int *)((long)&this->m_pDatas->m_CompressedSize + lVar4);
        lVar4 = lVar4 + 0x10;
      } while ((long)local_3c << 4 != lVar4);
    }
    local_44 = this->m_NumItemTypes;
    iVar5 = local_38 + local_40 * 4 + local_3c * 8;
    local_54 = 0x441544144;
    local_4c = local_34 + 0x14 + iVar5 + local_44 * 0xc;
    local_48 = iVar5 + 0x14 + local_44 * 0xc;
    io_write(this->m_File,&local_54,0x24);
    pCVar2 = this->m_pItemTypes;
    lVar7 = 0;
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar1 = *(int *)((long)&pCVar2->m_Num + lVar7);
      if (iVar1 != 0) {
        local_60 = (uint)lVar4;
        local_5c = iVar5;
        local_58 = iVar1;
        io_write(this->m_File,&local_60,0xc);
        pCVar2 = this->m_pItemTypes;
        iVar5 = iVar5 + *(int *)((long)&pCVar2->m_Num + lVar7);
      }
      lVar4 = lVar4 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar4 != 0xffff);
    lVar4 = 0;
    uVar6 = 0;
    do {
      if (this->m_pItemTypes[lVar4].m_Num != 0) {
        for (iVar5 = this->m_pItemTypes[lVar4].m_First; iVar5 != -1;
            iVar5 = this->m_pItems[iVar5].m_Next) {
          local_60 = uVar6;
          io_write(this->m_File,&local_60,4);
          uVar6 = uVar6 + this->m_pItems[iVar5].m_Size + 8;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xffff);
    if (0 < this->m_NumDatas) {
      lVar7 = 0;
      lVar4 = 4;
      uVar6 = 0;
      do {
        local_60 = uVar6;
        io_write(this->m_File,&local_60,4);
        uVar6 = uVar6 + *(int *)((long)&this->m_pDatas->m_UncompressedSize + lVar4);
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar7 < this->m_NumDatas);
      if (0 < this->m_NumDatas) {
        lVar7 = 0;
        lVar4 = 0;
        do {
          local_60 = *(uint *)((long)&this->m_pDatas->m_UncompressedSize + lVar7);
          io_write(this->m_File,&local_60,4);
          lVar4 = lVar4 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar4 < this->m_NumDatas);
      }
    }
    lVar4 = 0;
    do {
      if ((this->m_pItemTypes[lVar4].m_Num != 0) &&
         (iVar5 = this->m_pItemTypes[lVar4].m_First, iVar5 != -1)) {
        pCVar3 = this->m_pItems;
        do {
          local_60 = pCVar3[iVar5].m_ID | (int)lVar4 << 0x10;
          local_5c = pCVar3[iVar5].m_Size;
          io_write(this->m_File,&local_60,8);
          io_write(this->m_File,this->m_pItems[iVar5].m_pData,this->m_pItems[iVar5].m_Size);
          pCVar3 = this->m_pItems;
          iVar5 = pCVar3[iVar5].m_Next;
        } while (iVar5 != -1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xffff);
    iVar5 = this->m_NumDatas;
    if (0 < iVar5) {
      lVar4 = 8;
      lVar7 = 0;
      do {
        io_write(this->m_File,*(void **)((long)&this->m_pDatas->m_UncompressedSize + lVar4),
                 *(uint *)((long)this->m_pDatas + lVar4 + -4));
        lVar7 = lVar7 + 1;
        iVar5 = this->m_NumDatas;
        lVar4 = lVar4 + 0x10;
      } while (lVar7 < iVar5);
    }
    if (0 < this->m_NumItems) {
      lVar4 = 0x18;
      lVar7 = 0;
      do {
        mem_free(*(void **)((long)&this->m_pItems->m_Type + lVar4));
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + 0x20;
      } while (lVar7 < this->m_NumItems);
      iVar5 = this->m_NumDatas;
    }
    if (0 < iVar5) {
      lVar4 = 8;
      lVar7 = 0;
      do {
        mem_free(*(void **)((long)&this->m_pDatas->m_UncompressedSize + lVar4));
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar7 < this->m_NumDatas);
    }
    io_close(this->m_File);
    this->m_File = (IOHANDLE)0x0;
    iVar5 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int CDataFileWriter::Finish()
{
	if(!m_File) return 0;

	int ItemSize = 0;
	int TypesSize, HeaderSize, OffsetSize, FileSize, SwapSize;
	int DataSize = 0;
	CDatafileHeader Header;

	// we should now write this file!
	if(DEBUG)
		dbg_msg("datafile", "writing");

	// calculate sizes
	for(int i = 0; i < m_NumItems; i++)
	{
		if(DEBUG)
			dbg_msg("datafile", "item=%d size=%d (%d)", i, m_pItems[i].m_Size, (int)(m_pItems[i].m_Size+sizeof(CDatafileItem)));
		ItemSize += m_pItems[i].m_Size + sizeof(CDatafileItem);
	}


	for(int i = 0; i < m_NumDatas; i++)
		DataSize += m_pDatas[i].m_CompressedSize;

	// calculate the complete size
	TypesSize = m_NumItemTypes*sizeof(CDatafileItemType);
	HeaderSize = sizeof(CDatafileHeader);
	OffsetSize = (m_NumItems + m_NumDatas + m_NumDatas) * sizeof(int); // ItemOffsets, DataOffsets, DataUncompressedSizes
	FileSize = HeaderSize + TypesSize + OffsetSize + ItemSize + DataSize;
	SwapSize = FileSize - DataSize;

	(void)SwapSize;

	if(DEBUG)
		dbg_msg("datafile", "num_m_aItemTypes=%d TypesSize=%d m_aItemsize=%d DataSize=%d", m_NumItemTypes, TypesSize, ItemSize, DataSize);

	// construct Header
	{
		Header.m_aID[0] = 'D';
		Header.m_aID[1] = 'A';
		Header.m_aID[2] = 'T';
		Header.m_aID[3] = 'A';
		Header.m_Version = 4;
		Header.m_Size = FileSize - 16;
		Header.m_Swaplen = SwapSize - 16;
		Header.m_NumItemTypes = m_NumItemTypes;
		Header.m_NumItems = m_NumItems;
		Header.m_NumRawData = m_NumDatas;
		Header.m_ItemSize = ItemSize;
		Header.m_DataSize = DataSize;

		// write Header
		if(DEBUG)
			dbg_msg("datafile", "HeaderSize=%d", (int)sizeof(Header));
#if defined(CONF_ARCH_ENDIAN_BIG)
		swap_endian(&Header, sizeof(int), sizeof(Header)/sizeof(int));
#endif
		io_write(m_File, &Header, sizeof(Header));
	}

	// write types
	for(int i = 0, Count = 0; i < 0xffff; i++)
	{
		if(m_pItemTypes[i].m_Num)
		{
			// write info
			CDatafileItemType Info;
			Info.m_Type = i;
			Info.m_Start = Count;
			Info.m_Num = m_pItemTypes[i].m_Num;
			if(DEBUG)
				dbg_msg("datafile", "writing type=%x start=%d num=%d", Info.m_Type, Info.m_Start, Info.m_Num);
#if defined(CONF_ARCH_ENDIAN_BIG)
			swap_endian(&Info, sizeof(int), sizeof(CDatafileItemType)/sizeof(int));
#endif
			io_write(m_File, &Info, sizeof(Info));
			Count += m_pItemTypes[i].m_Num;
		}
	}

	// write item offsets
	for(int i = 0, Offset = 0; i < 0xffff; i++)
	{
		if(m_pItemTypes[i].m_Num)
		{
			// write all m_pItems in of this type
			int k = m_pItemTypes[i].m_First;
			while(k != -1)
			{
				if(DEBUG)
					dbg_msg("datafile", "writing item offset num=%d offset=%d", k, Offset);
				int Temp = Offset;
#if defined(CONF_ARCH_ENDIAN_BIG)
				swap_endian(&Temp, sizeof(int), sizeof(Temp)/sizeof(int));
#endif
				io_write(m_File, &Temp, sizeof(Temp));
				Offset += m_pItems[k].m_Size + sizeof(CDatafileItem);

				// next
				k = m_pItems[k].m_Next;
			}
		}
	}

	// write data offsets
	for(int i = 0, Offset = 0; i < m_NumDatas; i++)
	{
		if(DEBUG)
			dbg_msg("datafile", "writing data offset num=%d offset=%d", i, Offset);
		int Temp = Offset;
#if defined(CONF_ARCH_ENDIAN_BIG)
		swap_endian(&Temp, sizeof(int), sizeof(Temp)/sizeof(int));
#endif
		io_write(m_File, &Temp, sizeof(Temp));
		Offset += m_pDatas[i].m_CompressedSize;
	}

	// write data uncompressed sizes
	for(int i = 0; i < m_NumDatas; i++)
	{
		if(DEBUG)
			dbg_msg("datafile", "writing data uncompressed size num=%d size=%d", i, m_pDatas[i].m_UncompressedSize);
		int UncompressedSize = m_pDatas[i].m_UncompressedSize;
#if defined(CONF_ARCH_ENDIAN_BIG)
		swap_endian(&UncompressedSize, sizeof(int), sizeof(UncompressedSize)/sizeof(int));
#endif
		io_write(m_File, &UncompressedSize, sizeof(UncompressedSize));
	}

	// write m_pItems
	for(int i = 0; i < 0xffff; i++)
	{
		if(m_pItemTypes[i].m_Num)
		{
			// write all m_pItems in of this type
			int k = m_pItemTypes[i].m_First;
			while(k != -1)
			{
				CDatafileItem Item;
				Item.m_TypeAndID = (i<<16)|m_pItems[k].m_ID;
				Item.m_Size = m_pItems[k].m_Size;
				if(DEBUG)
					dbg_msg("datafile", "writing item type=%x idx=%d id=%d size=%d", i, k, m_pItems[k].m_ID, m_pItems[k].m_Size);

#if defined(CONF_ARCH_ENDIAN_BIG)
				swap_endian(&Item, sizeof(int), sizeof(Item)/sizeof(int));
				swap_endian(m_pItems[k].m_pData, sizeof(int), m_pItems[k].m_Size/sizeof(int));
#endif
				io_write(m_File, &Item, sizeof(Item));
				io_write(m_File, m_pItems[k].m_pData, m_pItems[k].m_Size);

				// next
				k = m_pItems[k].m_Next;
			}
		}
	}

	// write data
	for(int i = 0; i < m_NumDatas; i++)
	{
		if(DEBUG)
			dbg_msg("datafile", "writing data id=%d size=%d", i, m_pDatas[i].m_CompressedSize);
		io_write(m_File, m_pDatas[i].m_pCompressedData, m_pDatas[i].m_CompressedSize);
	}

	// free data
	for(int i = 0; i < m_NumItems; i++)
		mem_free(m_pItems[i].m_pData);
	for(int i = 0; i < m_NumDatas; ++i)
		mem_free(m_pDatas[i].m_pCompressedData);

	io_close(m_File);
	m_File = 0;

	if(DEBUG)
		dbg_msg("datafile", "done");
	return 1;
}